

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# markdownhighlighter.cpp
# Opt level: O2

void __thiscall MarkdownHighlighter::highlightCommentBlock(MarkdownHighlighter *this,QString *text)

{
  ulong uVar1;
  char cVar2;
  bool bVar3;
  int iVar4;
  QLatin1String QVar5;
  QArrayDataPointer<char16_t> local_90;
  QString endText;
  QString startText;
  QArrayDataPointer<char16_t> local_48;
  
  QVar5.m_data = (char *)0x4;
  QVar5.m_size = (qsizetype)text;
  cVar2 = QString::startsWith(QVar5,0x144628);
  if (cVar2 != '\0') {
    return;
  }
  cVar2 = QString::startsWith((QChar)(char16_t)text,9);
  if (cVar2 != '\0') {
    return;
  }
  QString::trimmed_helper((QString *)&local_90);
  startText.d.d = (Data *)0x0;
  startText.d.ptr = L"<!--";
  startText.d.size = 4;
  endText.d.d = (Data *)0x0;
  endText.d.ptr = (char16_t *)0x0;
  endText.d.size = 0;
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&endText.d);
  endText.d.d = (Data *)0x0;
  endText.d.ptr = L"-->";
  endText.d.size = 3;
  local_48.d = (Data *)0x0;
  local_48.ptr = (char16_t *)0x0;
  local_48.size = 0;
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_48);
  cVar2 = QString::startsWith((QString *)&local_90,(CaseSensitivity)&startText);
  if (((cVar2 != '\0') &&
      (bVar3 = QString::contains((QString *)&local_90,&endText,CaseSensitive), bVar3)) ||
     ((cVar2 = QString::startsWith((QString *)&local_90,(CaseSensitivity)&startText), cVar2 == '\0'
      && (bVar3 = QString::contains((QString *)&local_90,&startText,CaseSensitive), bVar3))))
  goto LAB_0011f06e;
  cVar2 = QString::startsWith((QString *)&local_90,(CaseSensitivity)&startText);
  bVar3 = true;
  if (cVar2 == '\0') {
    cVar2 = QString::endsWith((QString *)&local_90,(CaseSensitivity)&endText);
    if (cVar2 == '\0') {
      iVar4 = QSyntaxHighlighter::previousBlockState();
      bVar3 = iVar4 == 0xb;
    }
    else {
      bVar3 = false;
    }
  }
  cVar2 = QString::endsWith((QString *)&local_90,(CaseSensitivity)&endText);
  if (cVar2 == '\0') {
    if (!bVar3) goto LAB_0011f06e;
LAB_0011f038:
    QSyntaxHighlighter::setCurrentBlockState((int)this);
  }
  else {
    iVar4 = QSyntaxHighlighter::previousBlockState();
    if (bVar3) goto LAB_0011f038;
    if (iVar4 != 0xb) goto LAB_0011f06e;
  }
  uVar1 = (text->d).size;
  local_48.d = (Data *)CONCAT44(local_48.d._4_4_,0xb);
  QHash<MarkdownHighlighter::HighlighterState,_QTextCharFormat>::operator[]
            (&_formats,(HighlighterState *)&local_48);
  QSyntaxHighlighter::setFormat((int)this,0,(QTextCharFormat *)(uVar1 & 0xffffffff));
LAB_0011f06e:
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&endText.d);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&startText.d);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_90);
  return;
}

Assistant:

void MarkdownHighlighter::highlightCommentBlock(const QString &text) {
    if (text.startsWith(QLatin1String("    ")) ||
        text.startsWith(QLatin1Char('\t')))
        return;

    const QString &trimmedText = text.trimmed();
    const QString startText(QStringLiteral("<!--"));
    const QString endText(QStringLiteral("-->"));

    // we will skip this case because that is an inline comment and causes
    // troubles here
    if (trimmedText.startsWith(startText) && trimmedText.contains(endText)) {
        return;
    }

    if (!trimmedText.startsWith(startText) && trimmedText.contains(startText))
        return;

    const bool isComment =
        trimmedText.startsWith(startText) ||
        (!trimmedText.endsWith(endText) && previousBlockState() == Comment);
    const bool isCommentEnd =
        trimmedText.endsWith(endText) && previousBlockState() == Comment;
    const bool highlight = isComment || isCommentEnd;

    if (isComment) setCurrentBlockState(Comment);
    if (highlight) setFormat(0, text.length(), _formats[Comment]);
}